

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall crnlib::sparse_bit_array::set_bit_range(sparse_bit_array *this,uint index,uint num)

{
  uint uVar1;
  uint uVar2;
  uint32 msk_1;
  uint bits_to_set_1;
  uint group_bit_ofs_1;
  uint32 *pGroup_2;
  uint32 *puStack_48;
  uint group_index_2;
  uint32 *pGroup_1;
  uint group_index_1;
  uint32 msk;
  uint bits_to_set;
  uint max_bits_to_set;
  uint dword_bit_ofs;
  uint group_bit_ofs;
  uint32 *pGroup;
  uint local_18;
  uint group_index;
  uint num_local;
  uint index_local;
  sparse_bit_array *this_local;
  
  if (num != 0) {
    local_18 = num;
    group_index = index;
    if (num == 1) {
      set_bit(this,index);
    }
    else {
      for (; (group_index & 0x1ff) != 0 || local_18 < 0x201; group_index = uVar1 + group_index) {
        _dword_bit_ofs = this->m_ppGroups[group_index >> 9];
        if (_dword_bit_ofs == (uint32 *)0x0) {
          _dword_bit_ofs = alloc_group(true);
          this->m_ppGroups[group_index >> 9] = _dword_bit_ofs;
        }
        uVar1 = math::minimum<unsigned_int>(0x20 - (group_index & 0x1f),local_18);
        uVar2 = (group_index & 0x1ff) >> 5;
        _dword_bit_ofs[uVar2] =
             (0xffffffffU >> (0x20U - (char)uVar1 & 0x1f)) << (sbyte)(group_index & 0x1f) |
             _dword_bit_ofs[uVar2];
        local_18 = local_18 - uVar1;
        if (local_18 == 0) {
          return;
        }
      }
      for (; 0x1ff < local_18; local_18 = local_18 - 0x200) {
        puStack_48 = this->m_ppGroups[group_index >> 9];
        if (puStack_48 == (uint32 *)0x0) {
          puStack_48 = alloc_group(true);
          this->m_ppGroups[group_index >> 9] = puStack_48;
        }
        memset(puStack_48,0xff,0x40);
        group_index = group_index + 0x200;
      }
      for (; local_18 != 0; local_18 = local_18 - uVar1) {
        _bits_to_set_1 = this->m_ppGroups[group_index >> 9];
        if (_bits_to_set_1 == (uint32 *)0x0) {
          _bits_to_set_1 = alloc_group(true);
          this->m_ppGroups[group_index >> 9] = _bits_to_set_1;
        }
        uVar1 = math::minimum<unsigned_int>(0x20,local_18);
        uVar2 = (group_index & 0x1ff) >> 5;
        _bits_to_set_1[uVar2] =
             (0xffffffffU >> (0x20U - (char)uVar1 & 0x1f)) << ((byte)(group_index & 0x1ff) & 0x1f) |
             _bits_to_set_1[uVar2];
        group_index = uVar1 + group_index;
      }
    }
  }
  return;
}

Assistant:

void sparse_bit_array::set_bit_range(uint index, uint num)
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return;
        }
        else if (num == 1)
        {
            set_bit(index);
            return;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (!pGroup)
            {
                pGroup = alloc_group(true);
                m_ppGroups[group_index] = pGroup;
            }

            const uint group_bit_ofs = index & cBitsPerGroupMask;

            const uint dword_bit_ofs = group_bit_ofs & 31;
            const uint max_bits_to_set = 32 - dword_bit_ofs;

            const uint bits_to_set = math::minimum(max_bits_to_set, num);
            const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

            pGroup[group_bit_ofs >> 5] |= (msk << dword_bit_ofs);

            num -= bits_to_set;
            if (!num)
            {
                return;
            }

            index += bits_to_set;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (!pGroup)
            {
                pGroup = alloc_group(true);
                m_ppGroups[group_index] = pGroup;
            }

            memset(pGroup, 0xFF, sizeof(uint32) * cDWORDsPerGroup);

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (!pGroup)
            {
                pGroup = alloc_group(true);
                m_ppGroups[group_index] = pGroup;
            }

            uint group_bit_ofs = index & cBitsPerGroupMask;

            uint bits_to_set = math::minimum(32U, num);
            uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_set));

            pGroup[group_bit_ofs >> 5] |= (msk << (group_bit_ofs & 31));

            num -= bits_to_set;
            index += bits_to_set;
        }
    }